

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_rex_scanfn(arg_rex *parent,char *argval)

{
  int iVar1;
  undefined8 *puVar2;
  TRexBool TVar3;
  TRex *exp;
  privhdr *priv;
  TRexBool is_match;
  TRex *rex;
  char *error;
  char *pcStack_18;
  int errorcode;
  char *argval_local;
  arg_rex *parent_local;
  
  error._4_4_ = 0;
  rex = (TRex *)0x0;
  if (parent->count == (parent->hdr).maxcount) {
    error._4_4_ = 2;
  }
  else if (argval == (char *)0x0) {
    parent->count = parent->count + 1;
  }
  else {
    puVar2 = (undefined8 *)(parent->hdr).priv;
    pcStack_18 = argval;
    argval_local = (char *)parent;
    exp = trex_compile((char *)*puVar2,(char **)&rex,*(int *)(puVar2 + 1));
    TVar3 = trex_match(exp,pcStack_18);
    if (TVar3 == 0) {
      error._4_4_ = 7;
    }
    else {
      iVar1 = *(int *)(argval_local + 0x60);
      *(int *)(argval_local + 0x60) = iVar1 + 1;
      *(char **)(*(long *)(argval_local + 0x68) + (long)iVar1 * 8) = pcStack_18;
    }
    trex_free(exp);
  }
  return error._4_4_;
}

Assistant:

static int arg_rex_scanfn(struct arg_rex * parent, const char * argval) {
	int errorcode = 0;
	const TRexChar * error = NULL;
	TRex * rex = NULL;
	TRexBool is_match = TRex_False;

	if (parent->count == parent->hdr.maxcount ) {
		/* maximum number of arguments exceeded */
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* a valid argument with no argument value was given. */
		/* This happens when an optional argument value was invoked. */
		/* leave parent argument value unaltered but still count the argument. */
		parent->count++;
	} else {
		struct privhdr * priv = (struct privhdr *)parent->hdr.priv;

		/* test the current argument value for a match with the regular expression */
		/* if a match is detected, record the argument value in the arg_rex struct */

		rex = trex_compile(priv->pattern, &error, priv->flags);
		is_match = trex_match(rex, argval);

		if (!is_match) {
			errorcode = EREGNOMATCH;
		} else {
			parent->sval[parent->count++] = argval;
		}

		trex_free(rex);
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}